

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBaseExc.cpp
# Opt level: O0

void anon_unknown.dwarf_10923::test2(void)

{
  ostream *this;
  int i;
  int local_4;
  
  this = std::operator<<((ostream *)&std::cout,"invalid operations / exception handling on");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  Iex_3_2::mathExcOn(0x15);
  for (local_4 = 0; local_4 < 3; local_4 = local_4 + 1) {
    test2a();
    test2b();
    test2c();
  }
  return;
}

Assistant:

void
test2 ()
{
    std::cout << "2" << std::endl;

    try
    {
        throwLogicError ();
    }
    catch (const IEX_INTERNAL_NAMESPACE::ArgExc&)
    {
        assert (false);
    }
    catch (std::exception&)
    {
        return;
    }
    catch (...)
    {
        assert (false);
    }

    assert (false);
}